

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O3

void __thiscall re2::PrefilterTree::~PrefilterTree(PrefilterTree *this)

{
  Prefilter *this_00;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_01;
  pointer piVar1;
  pointer ppPVar2;
  pointer pEVar3;
  ulong uVar4;
  long lVar5;
  
  ppPVar2 = (this->prefilter_vec_).
            super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->prefilter_vec_).super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppPVar2) {
    uVar4 = 0;
    do {
      this_00 = ppPVar2[uVar4];
      if (this_00 != (Prefilter *)0x0) {
        Prefilter::~Prefilter(this_00);
      }
      operator_delete(this_00);
      uVar4 = uVar4 + 1;
      ppPVar2 = (this->prefilter_vec_).
                super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->prefilter_vec_).
                                   super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar2 >> 3))
    ;
  }
  pEVar3 = (this->entries_).
           super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->entries_).
      super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish != pEVar3) {
    lVar5 = 8;
    uVar4 = 0;
    do {
      this_01 = *(_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  **)((long)&pEVar3->propagate_up_at_count + lVar5);
      if (this_01 !=
          (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)0x0) {
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree(this_01);
      }
      operator_delete(this_01);
      uVar4 = uVar4 + 1;
      pEVar3 = (this->entries_).
               super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x28;
    } while (uVar4 < (ulong)(((long)(this->entries_).
                                    super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3 >> 3)
                            * -0x3333333333333333));
  }
  piVar1 = (this->atom_index_to_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  ppPVar2 = (this->prefilter_vec_).
            super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppPVar2 != (pointer)0x0) {
    operator_delete(ppPVar2);
  }
  piVar1 = (this->unfiltered_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>_>
  ::~_Rb_tree(&(this->node_map_)._M_t);
  std::vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>::~vector
            (&this->entries_);
  return;
}

Assistant:

PrefilterTree::~PrefilterTree() {
  for (size_t i = 0; i < prefilter_vec_.size(); i++)
    delete prefilter_vec_[i];

  for (size_t i = 0; i < entries_.size(); i++)
    delete entries_[i].parents;
}